

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O3

void __thiscall HighsSearch::flushStatistics(HighsSearch *this)

{
  double dVar1;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  _Var2._M_head_impl =
       (this->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  (_Var2._M_head_impl)->num_nodes = (_Var2._M_head_impl)->num_nodes + this->nnodes;
  this->nnodes = 0;
  dVar5 = (this->treeweight).hi;
  dVar1 = ((_Var2._M_head_impl)->pruned_treeweight).hi;
  dVar6 = dVar5 + dVar1;
  ((_Var2._M_head_impl)->pruned_treeweight).hi = dVar6;
  dVar5 = (dVar1 - (dVar6 - dVar5)) + (dVar5 - (dVar6 - (dVar6 - dVar5))) +
          *(double *)((long)&(_Var2._M_head_impl)->pruned_treeweight + 8);
  *(double *)((long)&(_Var2._M_head_impl)->pruned_treeweight + 8) = dVar5;
  *(double *)((long)&(_Var2._M_head_impl)->pruned_treeweight + 8) = dVar5 + (this->treeweight).lo;
  (this->treeweight).hi = 0.0;
  (this->treeweight).lo = 0.0;
  lVar3 = this->lpiterations;
  lVar4 = this->heurlpiterations;
  this->lpiterations = 0;
  (_Var2._M_head_impl)->total_lp_iterations = (_Var2._M_head_impl)->total_lp_iterations + lVar3;
  (_Var2._M_head_impl)->heuristic_lp_iterations =
       (_Var2._M_head_impl)->heuristic_lp_iterations + lVar4;
  this->heurlpiterations = 0;
  (_Var2._M_head_impl)->sb_lp_iterations =
       (_Var2._M_head_impl)->sb_lp_iterations + this->sblpiterations;
  this->sblpiterations = 0;
  return;
}

Assistant:

void HighsSearch::flushStatistics() {
  mipsolver.mipdata_->num_nodes += nnodes;
  nnodes = 0;

  mipsolver.mipdata_->pruned_treeweight += treeweight;
  treeweight = 0;

  mipsolver.mipdata_->total_lp_iterations += lpiterations;
  lpiterations = 0;

  mipsolver.mipdata_->heuristic_lp_iterations += heurlpiterations;
  heurlpiterations = 0;

  mipsolver.mipdata_->sb_lp_iterations += sblpiterations;
  sblpiterations = 0;
}